

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O0

void update_dci_ctl(vdpp2_params *src_params)

{
  RK_S32 local_1c;
  RK_S32 local_18;
  RK_S32 dci_rbuv_swap;
  RK_S32 dci_alpha_swap;
  RK_S32 dci_format;
  vdpp2_params *src_params_local;
  
  if (((src_params->src_fmt & 0xf0000) == 0) && ((src_params->src_fmt & 0xfffff) < 0x14)) {
    dci_rbuv_swap = vdpp_src_yuv_cfg[src_params->src_fmt].format;
    local_18 = vdpp_src_yuv_cfg[src_params->src_fmt].alpha_swap;
    local_1c = vdpp_src_yuv_cfg[src_params->src_fmt].rbuv_swap;
  }
  else {
    if (((src_params->src_fmt & 0xf0000) != 0x10000) || (0x1000f < (src_params->src_fmt & 0xfffff)))
    {
      _mpp_log_l(2,"vdpp2","warning: invalid input format %d",0,src_params->src_fmt);
      return;
    }
    dci_rbuv_swap = vdpp_src_rgb_cfg[src_params->src_fmt - 0x10000].format;
    local_18 = vdpp_src_rgb_cfg[src_params->src_fmt - 0x10000].alpha_swap;
    local_1c = vdpp_src_rgb_cfg[src_params->src_fmt - 0x10000].rbuv_swap;
  }
  src_params->dci_format = dci_rbuv_swap;
  src_params->dci_alpha_swap = local_18;
  src_params->dci_rbuv_swap = local_1c;
  if ((vdpp2_debug & 1) != 0) {
    _mpp_log_l(4,"vdpp2","input format %d  dci_format %d",0,src_params->src_fmt,dci_rbuv_swap);
  }
  return;
}

Assistant:

static void update_dci_ctl(struct vdpp2_params* src_params)
{
    RK_S32 dci_format, dci_alpha_swap, dci_rbuv_swap;

    if (MPP_FRAME_FMT_IS_YUV(src_params->src_fmt)) {
        dci_format = vdpp_src_yuv_cfg[src_params->src_fmt - MPP_FRAME_FMT_YUV].format;
        dci_alpha_swap = vdpp_src_yuv_cfg[src_params->src_fmt - MPP_FRAME_FMT_YUV].alpha_swap;
        dci_rbuv_swap = vdpp_src_yuv_cfg[src_params->src_fmt - MPP_FRAME_FMT_YUV].rbuv_swap;
    } else if (MPP_FRAME_FMT_IS_RGB(src_params->src_fmt)) {
        dci_format = vdpp_src_rgb_cfg[src_params->src_fmt - MPP_FRAME_FMT_RGB].format;
        dci_alpha_swap = vdpp_src_rgb_cfg[src_params->src_fmt - MPP_FRAME_FMT_RGB].alpha_swap;
        dci_rbuv_swap = vdpp_src_rgb_cfg[src_params->src_fmt - MPP_FRAME_FMT_RGB].rbuv_swap;
    } else {
        mpp_err("warning: invalid input format %d", src_params->src_fmt);
        return;
    }

    src_params->dci_format = dci_format;
    src_params->dci_alpha_swap = dci_alpha_swap;
    src_params->dci_rbuv_swap = dci_rbuv_swap;

    VDPP2_DBG(VDPP2_DBG_TRACE, "input format %d  dci_format %d", src_params->src_fmt, dci_format);
}